

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int setjitmode(lua_State *L,int mode)

{
  int iVar1;
  int local_18;
  uint local_14;
  int idx;
  int mode_local;
  lua_State *L_local;
  
  local_18 = 0;
  local_14 = mode;
  if ((L->base != L->top) && (L->base->u64 != 0xffffffffffffffff)) {
    if (((int)(L->base->field_4).it >> 0xf == -9) || ((int)(L->base->field_4).it >> 0xf == -8)) {
      local_18 = 1;
    }
    else if ((int)(L->base->field_4).it >> 0xf != -3) goto LAB_001b40fb;
    if ((L->base + 1 < L->top) &&
       (((int)L->base[1].field_4.it >> 0xf == -2 || ((int)L->base[1].field_4.it >> 0xf == -3)))) {
      local_14 = 4;
      if ((int)L->base[1].field_4.it >> 0xf != -2) {
        local_14 = 3;
      }
      local_14 = local_14 | mode;
    }
    else {
      local_14 = mode | 2;
    }
  }
  iVar1 = luaJIT_setmode(L,local_18,local_14);
  if (iVar1 == 1) {
    return 0;
  }
  if ((local_14 & 0xff) == 0) {
    lj_err_caller(L,LJ_ERR_NOJIT);
  }
LAB_001b40fb:
  lj_err_argt(L,1,6);
}

Assistant:

static int setjitmode(lua_State *L, int mode)
{
  int idx = 0;
  if (L->base == L->top || tvisnil(L->base)) {  /* jit.on/off/flush([nil]) */
    mode |= LUAJIT_MODE_ENGINE;
  } else {
    /* jit.on/off/flush(func|proto, nil|true|false) */
    if (tvisfunc(L->base) || tvisproto(L->base))
      idx = 1;
    else if (!tvistrue(L->base))  /* jit.on/off/flush(true, nil|true|false) */
      goto err;
    if (L->base+1 < L->top && tvisbool(L->base+1))
      mode |= boolV(L->base+1) ? LUAJIT_MODE_ALLFUNC : LUAJIT_MODE_ALLSUBFUNC;
    else
      mode |= LUAJIT_MODE_FUNC;
  }
  if (luaJIT_setmode(L, idx, mode) != 1) {
    if ((mode & LUAJIT_MODE_MASK) == LUAJIT_MODE_ENGINE)
      lj_err_caller(L, LJ_ERR_NOJIT);
  err:
    lj_err_argt(L, 1, LUA_TFUNCTION);
  }
  return 0;
}